

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

opj_pi_iterator_t * pi_create_decode(opj_image_t *image,opj_cp_t *cp,int tileno)

{
  uint uVar1;
  opj_poc_t *poVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  OPJ_PROG_ORDER OVar10;
  opj_tcp_t *poVar11;
  opj_tccp_t *poVar12;
  opj_image_comp_t *poVar13;
  int iVar14;
  OPJ_UINT32 OVar15;
  opj_pi_iterator_t *pi;
  opj_pi_comp_t *poVar16;
  opj_pi_resolution_t *poVar17;
  long lVar18;
  short *psVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  OPJ_UINT32 OVar24;
  OPJ_UINT32 OVar25;
  uint uVar26;
  OPJ_UINT32 OVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  OPJ_UINT32 *pOVar31;
  uint uVar32;
  OPJ_PROG_ORDER *pOVar33;
  OPJ_UINT32 OVar34;
  uint uVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  uint uVar40;
  size_t __nmemb;
  undefined8 uVar41;
  OPJ_UINT32 local_f8;
  OPJ_UINT32 *local_98;
  
  poVar11 = cp->tcps;
  iVar14 = poVar11[tileno].numpocs;
  uVar1 = iVar14 + 1;
  pi = (opj_pi_iterator_t *)calloc((long)(int)uVar1,0xf8);
  if (pi == (opj_pi_iterator_t *)0x0) {
LAB_0012dd1a:
    pi = (opj_pi_iterator_t *)0x0;
  }
  else if (-1 < iVar14) {
    iVar14 = tileno / cp->tw;
    iVar23 = tileno % cp->tw;
    OVar27 = cp->tdx * iVar23 + cp->tx0;
    if ((int)OVar27 <= (int)image->x0) {
      OVar27 = image->x0;
    }
    OVar34 = cp->tdy * iVar14 + cp->ty0;
    if ((int)OVar34 <= (int)image->y0) {
      OVar34 = image->y0;
    }
    OVar24 = (iVar23 + 1) * cp->tdx + cp->tx0;
    if ((int)image->x1 <= (int)OVar24) {
      OVar24 = image->x1;
    }
    OVar15 = (iVar14 + 1) * cp->tdy + cp->ty0;
    if ((int)image->y1 <= (int)OVar15) {
      OVar15 = image->y1;
    }
    uVar3 = image->numcomps;
    uVar36 = 0;
    do {
      pi[uVar36].tx0 = OVar27;
      pi[uVar36].ty0 = OVar34;
      pi[uVar36].tx1 = OVar24;
      pi[uVar36].ty1 = OVar15;
      pi[uVar36].numcomps = uVar3;
      poVar16 = (opj_pi_comp_t *)calloc((ulong)uVar3,0x18);
      pi[uVar36].comps = poVar16;
      if (poVar16 == (opj_pi_comp_t *)0x0) {
LAB_0012dd0c:
        pi_destroy(pi,cp,tileno);
        goto LAB_0012dd1a;
      }
      iVar14 = pi->numcomps;
      if ((long)iVar14 < 1) {
        iVar23 = 0;
        local_f8 = 0;
      }
      else {
        poVar12 = poVar11[tileno].tccps;
        poVar13 = image->comps;
        local_98 = poVar12->prch;
        lVar18 = 0;
        local_f8 = 0;
        iVar23 = 0;
        do {
          OVar4 = poVar13[lVar18].dx;
          poVar16[lVar18].dx = OVar4;
          OVar5 = poVar13[lVar18].dy;
          poVar16[lVar18].dy = OVar5;
          OVar25 = poVar12[lVar18].numresolutions;
          __nmemb = (size_t)(int)OVar25;
          poVar16[lVar18].numresolutions = OVar25;
          poVar17 = (opj_pi_resolution_t *)calloc(__nmemb,0x10);
          poVar16[lVar18].resolutions = poVar17;
          if (poVar17 == (opj_pi_resolution_t *)0x0) goto LAB_0012dd0c;
          if ((int)local_f8 < (int)OVar25) {
            local_f8 = OVar25;
          }
          if (0 < (int)OVar25) {
            iVar6 = pi->ty1;
            iVar7 = pi->tx1;
            iVar8 = pi->ty0;
            iVar9 = pi->tx0;
            uVar22 = poVar12[lVar18].csty;
            lVar39 = 0;
            do {
              OVar25 = OVar25 - 1;
              if ((uVar22 & 1) == 0) {
                (&poVar17->pdx)[lVar39] = 0xf;
                iVar38 = 0xf;
                iVar37 = 0xf;
              }
              else {
                iVar38 = *(int *)((long)local_98 + lVar39 + -0x84);
                (&poVar17->pdx)[lVar39] = iVar38;
                iVar37 = *(int *)((long)local_98 + lVar39);
              }
              bVar20 = (byte)OVar25;
              iVar28 = 1 << (bVar20 & 0x1f);
              uVar32 = (int)((OVar4 - 1) + iVar9) / (int)OVar4 + -1 + iVar28 >> (bVar20 & 0x1f);
              uVar26 = (int)((OVar5 - 1) + iVar8) / (int)OVar5 + -1 + iVar28 >> (bVar20 & 0x1f);
              uVar35 = (int)(iVar7 + (OVar4 - 1)) / (int)OVar4 + -1 + iVar28 >> (bVar20 & 0x1f);
              uVar29 = iVar28 + (int)(iVar6 + (OVar5 - 1)) / (int)OVar5 + -1 >> (bVar20 & 0x1f);
              bVar20 = (byte)iVar37;
              uVar40 = -1 << (bVar20 & 0x1f);
              bVar21 = (byte)iVar38;
              uVar30 = -1 << (bVar21 & 0x1f);
              iVar38 = (int)((((1 << (bVar21 & 0x1f)) + uVar35) - 1 & uVar30) - (uVar30 & uVar32))
                       >> (bVar21 & 0x1f);
              if (uVar32 == uVar35) {
                iVar38 = 0;
              }
              iVar28 = (int)((((1 << (bVar20 & 0x1f)) + uVar29) - 1 & uVar40) - (uVar40 & uVar26))
                       >> (bVar20 & 0x1f);
              (&poVar17->pdy)[lVar39] = iVar37;
              (&poVar17->pw)[lVar39] = iVar38;
              if (uVar26 == uVar29) {
                iVar28 = 0;
              }
              (&poVar17->ph)[lVar39] = iVar28;
              if (iVar23 < iVar28 * iVar38) {
                iVar23 = iVar28 * iVar38;
              }
              lVar39 = lVar39 + 4;
            } while (__nmemb << 2 != lVar39);
          }
          lVar18 = lVar18 + 1;
          local_98 = local_98 + 0x10e;
        } while (lVar18 != iVar14);
      }
      pi[uVar36].step_p = 1;
      pi[uVar36].step_c = iVar23;
      pi[uVar36].step_r = uVar3 * iVar23;
      pi[uVar36].step_l = uVar3 * iVar23 * local_f8;
      if (uVar36 == 0) {
        psVar19 = (short *)calloc((ulong)(local_f8 * iVar23 * uVar3 * poVar11[tileno].numlayers),2);
        pi->include = psVar19;
        if (psVar19 == (short *)0x0) goto LAB_0012dd0c;
      }
      else {
        pi[uVar36].include = pi[uVar36 - 1].include;
      }
      if (poVar11[tileno].POC == 0) {
        uVar41 = 0;
        pOVar31 = (OPJ_UINT32 *)&poVar11[tileno].numlayers;
        pOVar33 = &poVar11[tileno].prg;
        uVar22 = uVar3;
      }
      else {
        poVar2 = poVar11[tileno].pocs + uVar36;
        uVar41._0_4_ = poVar2->resno0;
        uVar41._4_4_ = poVar2->compno0;
        local_f8 = poVar2->resno1;
        pOVar31 = &poVar2->layno1;
        pOVar33 = &poVar11[tileno].pocs[uVar36].prg;
        uVar22 = poVar2->compno1;
      }
      OVar10 = *pOVar33;
      OVar4 = *pOVar31;
      pi[uVar36].first = 1;
      pi[uVar36].poc.resno0 = (int)uVar41;
      pi[uVar36].poc.compno0 = (int)((ulong)uVar41 >> 0x20);
      pi[uVar36].poc.layno1 = OVar4;
      pi[uVar36].poc.resno1 = local_f8;
      pi[uVar36].poc.compno1 = uVar22;
      pi[uVar36].poc.prg = OVar10;
      pi[uVar36].poc.layno0 = 0;
      pi[uVar36].poc.precno0 = 0;
      pi[uVar36].poc.precno1 = iVar23;
      uVar36 = uVar36 + 1;
    } while (uVar36 != uVar1);
  }
  return pi;
}

Assistant:

opj_pi_iterator_t *pi_create_decode(opj_image_t *image, opj_cp_t *cp, int tileno) {
	int p, q;
	int compno, resno, pino;
	opj_pi_iterator_t *pi = NULL;
	opj_tcp_t *tcp = NULL;
	opj_tccp_t *tccp = NULL;

	tcp = &cp->tcps[tileno];

	pi = (opj_pi_iterator_t*) opj_calloc((tcp->numpocs + 1), sizeof(opj_pi_iterator_t));
	if(!pi) {
		/* TODO: throw an error */
		return NULL;
	}

	for (pino = 0; pino < tcp->numpocs + 1; pino++) {	/* change */
		int maxres = 0;
		int maxprec = 0;
		p = tileno % cp->tw;
		q = tileno / cp->tw;

		pi[pino].tx0 = int_max(cp->tx0 + p * cp->tdx, image->x0);
		pi[pino].ty0 = int_max(cp->ty0 + q * cp->tdy, image->y0);
		pi[pino].tx1 = int_min(cp->tx0 + (p + 1) * cp->tdx, image->x1);
		pi[pino].ty1 = int_min(cp->ty0 + (q + 1) * cp->tdy, image->y1);
		pi[pino].numcomps = image->numcomps;

		pi[pino].comps = (opj_pi_comp_t*) opj_calloc(image->numcomps, sizeof(opj_pi_comp_t));
		if(!pi[pino].comps) {
			/* TODO: throw an error */
			pi_destroy(pi, cp, tileno);
			return NULL;
		}
		
		for (compno = 0; compno < pi->numcomps; compno++) {
			int tcx0, tcy0, tcx1, tcy1;
			opj_pi_comp_t *comp = &pi[pino].comps[compno];
			tccp = &tcp->tccps[compno];
			comp->dx = image->comps[compno].dx;
			comp->dy = image->comps[compno].dy;
			comp->numresolutions = tccp->numresolutions;

			comp->resolutions = (opj_pi_resolution_t*) opj_calloc(comp->numresolutions, sizeof(opj_pi_resolution_t));
			if(!comp->resolutions) {
				/* TODO: throw an error */
				pi_destroy(pi, cp, tileno);
				return NULL;
			}

			tcx0 = int_ceildiv(pi->tx0, comp->dx);
			tcy0 = int_ceildiv(pi->ty0, comp->dy);
			tcx1 = int_ceildiv(pi->tx1, comp->dx);
			tcy1 = int_ceildiv(pi->ty1, comp->dy);
			if (comp->numresolutions > maxres) {
				maxres = comp->numresolutions;
			}

			for (resno = 0; resno < comp->numresolutions; resno++) {
				int levelno;
				int rx0, ry0, rx1, ry1;
				int px0, py0, px1, py1;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				if (tccp->csty & J2K_CCP_CSTY_PRT) {
					res->pdx = tccp->prcw[resno];
					res->pdy = tccp->prch[resno];
				} else {
					res->pdx = 15;
					res->pdy = 15;
				}
				levelno = comp->numresolutions - 1 - resno;
				rx0 = int_ceildivpow2(tcx0, levelno);
				ry0 = int_ceildivpow2(tcy0, levelno);
				rx1 = int_ceildivpow2(tcx1, levelno);
				ry1 = int_ceildivpow2(tcy1, levelno);
				px0 = int_floordivpow2(rx0, res->pdx) << res->pdx;
				py0 = int_floordivpow2(ry0, res->pdy) << res->pdy;
				px1 = int_ceildivpow2(rx1, res->pdx) << res->pdx;
				py1 = int_ceildivpow2(ry1, res->pdy) << res->pdy;
				res->pw = (rx0==rx1)?0:((px1 - px0) >> res->pdx);
				res->ph = (ry0==ry1)?0:((py1 - py0) >> res->pdy);
				
				if (res->pw*res->ph > maxprec) {
					maxprec = res->pw*res->ph;
				}
				
			}
		}
		
		tccp = &tcp->tccps[0];
		pi[pino].step_p = 1;
		pi[pino].step_c = maxprec * pi[pino].step_p;
		pi[pino].step_r = image->numcomps * pi[pino].step_c;
		pi[pino].step_l = maxres * pi[pino].step_r;
		
		if (pino == 0) {
			pi[pino].include = (short int*) opj_calloc(image->numcomps * maxres * tcp->numlayers * maxprec, sizeof(short int));
			if(!pi[pino].include) {
				/* TODO: throw an error */
				pi_destroy(pi, cp, tileno);
				return NULL;
			}
		}
		else {
			pi[pino].include = pi[pino - 1].include;
		}
		
		if (tcp->POC == 0) {
			pi[pino].first = 1;
			pi[pino].poc.resno0 = 0;
			pi[pino].poc.compno0 = 0;
			pi[pino].poc.layno1 = tcp->numlayers;
			pi[pino].poc.resno1 = maxres;
			pi[pino].poc.compno1 = image->numcomps;
			pi[pino].poc.prg = tcp->prg;
		} else {
			pi[pino].first = 1;
			pi[pino].poc.resno0 = tcp->pocs[pino].resno0;
			pi[pino].poc.compno0 = tcp->pocs[pino].compno0;
			pi[pino].poc.layno1 = tcp->pocs[pino].layno1;
			pi[pino].poc.resno1 = tcp->pocs[pino].resno1;
			pi[pino].poc.compno1 = tcp->pocs[pino].compno1;
			pi[pino].poc.prg = tcp->pocs[pino].prg;
		}
		pi[pino].poc.layno0  = 0;
		pi[pino].poc.precno0 = 0; 
		pi[pino].poc.precno1 = maxprec;
			
	}
	
	return pi;
}